

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_utils.h
# Opt level: O0

int get_regulated_q_undershoot
              (AV1_COMP *cpi,int is_encode_stage,int q_high,int top_index,int bottom_index)

{
  int height;
  long lVar1;
  long lVar2;
  undefined4 in_ECX;
  int in_EDX;
  long in_RDI;
  undefined4 in_R8D;
  int retries;
  int q_regulated;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int in_stack_00000038;
  int in_stack_0000003c;
  AV1_COMP *in_stack_00000040;
  int local_30;
  int in_stack_ffffffffffffffd4;
  
  lVar1 = in_RDI + 0x3bf80;
  lVar2 = in_RDI + 0x60770;
  av1_rc_update_rate_correction_factors
            (in_stack_00000040,in_stack_0000003c,in_stack_00000038,cpi._4_4_);
  height = av1_rc_regulate_q((AV1_COMP *)CONCAT44(in_ECX,in_R8D),(int)((ulong)lVar1 >> 0x20),
                             (int)lVar1,(int)((ulong)lVar2 >> 0x20),(int)lVar2,
                             in_stack_ffffffffffffffd4);
  for (local_30 = 0; in_EDX < height && local_30 < 10; local_30 = local_30 + 1) {
    av1_rc_update_rate_correction_factors
              (in_stack_00000040,in_stack_0000003c,in_stack_00000038,cpi._4_4_);
    height = av1_rc_regulate_q((AV1_COMP *)CONCAT44(in_ECX,in_R8D),(int)((ulong)lVar1 >> 0x20),
                               (int)lVar1,(int)((ulong)lVar2 >> 0x20),(int)lVar2,height);
  }
  return height;
}

Assistant:

static inline int get_regulated_q_undershoot(AV1_COMP *const cpi,
                                             int is_encode_stage, int q_high,
                                             int top_index, int bottom_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;

  av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                        cm->height);
  int q_regulated = av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                                      top_index, cm->width, cm->height);

  int retries = 0;
  while (q_regulated > q_high && retries < 10) {
    av1_rc_update_rate_correction_factors(cpi, is_encode_stage, cm->width,
                                          cm->height);
    q_regulated = av1_rc_regulate_q(cpi, rc->this_frame_target, bottom_index,
                                    top_index, cm->width, cm->height);
    retries++;
  }
  return q_regulated;
}